

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_engines.cc
# Opt level: O1

tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_> *
generate_list<trng::mrg4>
          (tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>
           *__return_storage_ptr__,mrg4 *r1,mrg4 *r2,long N,long skip1,long skip2)

{
  int iVar1;
  _Tuple_impl<0ul,std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>> *p_Var2
  ;
  int iVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  vector<int,_std::allocator<int>_> v2;
  vector<int,_std::allocator<int>_> v1;
  int local_a4;
  long local_a0;
  mrg4 *local_98;
  mrg4 *local_90;
  vector<int,_std::allocator<int>_> local_88;
  vector<int,_std::allocator<int>_> local_68;
  long local_50;
  long local_48;
  _Tuple_impl<0ul,std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>
  *local_40;
  long local_38;
  
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_98 = r2;
  local_90 = r1;
  local_50 = skip1;
  local_48 = skip2;
  local_40 = (_Tuple_impl<0ul,std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>
              *)__return_storage_ptr__;
  local_38 = N;
  if (0 < N) {
    std::vector<int,_std::allocator<int>_>::reserve(&local_68,N);
    std::vector<int,_std::allocator<int>_>::reserve(&local_88,N);
    lVar7 = 0;
    do {
      iVar8 = (local_90->S).r[0];
      iVar1 = (local_90->S).r[1];
      iVar10 = (local_90->S).r[2];
      uVar5 = (long)(local_90->S).r[3] * (long)(local_90->P).a[3] +
              (long)(local_90->P).a[2] * (long)iVar10 +
              (long)(local_90->P).a[1] * (long)iVar1 + (long)(local_90->P).a[0] * (long)iVar8;
      (local_90->S).r[3] = iVar10;
      uVar6 = (uVar5 >> 0x1f) + (uVar5 & 0x7fffffff);
      uVar5 = uVar6 - 0x1fffffffc;
      if (uVar6 < 0x1fffffffc) {
        uVar5 = uVar6;
      }
      (local_90->S).r[2] = iVar1;
      (local_90->S).r[1] = iVar8;
      uVar6 = uVar5 - 0xfffffffe;
      if (uVar5 < 0xfffffffe) {
        uVar6 = uVar5;
      }
      local_a4 = (int)uVar6 + -0x7fffffff;
      if (uVar6 < 0x7fffffff) {
        local_a4 = (int)uVar6;
      }
      (local_90->S).r[0] = local_a4;
      local_a0 = lVar7;
      if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_68,
                   (iterator)
                   local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_a4);
      }
      else {
        *local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_a4;
        local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      iVar8 = (local_98->S).r[0];
      iVar1 = (local_98->S).r[1];
      iVar10 = (local_98->S).r[2];
      uVar5 = (long)(local_98->S).r[3] * (long)(local_98->P).a[3] +
              (long)(local_98->P).a[2] * (long)iVar10 +
              (long)(local_98->P).a[1] * (long)iVar1 + (long)(local_98->P).a[0] * (long)iVar8;
      (local_98->S).r[3] = iVar10;
      uVar6 = (uVar5 >> 0x1f) + (uVar5 & 0x7fffffff);
      uVar5 = uVar6 - 0x1fffffffc;
      if (uVar6 < 0x1fffffffc) {
        uVar5 = uVar6;
      }
      (local_98->S).r[2] = iVar1;
      (local_98->S).r[1] = iVar8;
      uVar6 = uVar5 - 0xfffffffe;
      if (uVar5 < 0xfffffffe) {
        uVar6 = uVar5;
      }
      local_a4 = (int)uVar6 + -0x7fffffff;
      if (uVar6 < 0x7fffffff) {
        local_a4 = (int)uVar6;
      }
      (local_98->S).r[0] = local_a4;
      if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_88,
                   (iterator)
                   local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_a4);
      }
      else {
        *local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_a4;
        local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      if (0 < local_50) {
        lVar7 = local_50;
        iVar8 = (local_90->S).r[3];
        iVar1 = (local_90->S).r[2];
        iVar10 = (local_90->S).r[0];
        iVar9 = (local_90->S).r[1];
        do {
          iVar4 = iVar9;
          iVar9 = iVar10;
          iVar3 = iVar1;
          uVar5 = (long)iVar8 * (long)(local_90->P).a[3] + (long)iVar3 * (long)(local_90->P).a[2] +
                  (long)iVar4 * (long)(local_90->P).a[1] + (long)iVar9 * (long)(local_90->P).a[0];
          uVar6 = (uVar5 >> 0x1f) + (uVar5 & 0x7fffffff);
          uVar5 = uVar6 - 0x1fffffffc;
          if (uVar6 < 0x1fffffffc) {
            uVar5 = uVar6;
          }
          uVar6 = uVar5 - 0xfffffffe;
          if (uVar5 < 0xfffffffe) {
            uVar6 = uVar5;
          }
          iVar10 = (int)uVar6 + -0x7fffffff;
          if (uVar6 < 0x7fffffff) {
            iVar10 = (int)uVar6;
          }
          lVar7 = lVar7 + -1;
          iVar8 = iVar3;
          iVar1 = iVar4;
        } while (lVar7 != 0);
        (local_90->S).r[3] = iVar3;
        (local_90->S).r[2] = iVar4;
        (local_90->S).r[1] = iVar9;
        (local_90->S).r[0] = iVar10;
      }
      if (0 < local_48) {
        lVar7 = local_48;
        iVar8 = (local_98->S).r[3];
        iVar1 = (local_98->S).r[2];
        iVar10 = (local_98->S).r[0];
        iVar9 = (local_98->S).r[1];
        do {
          iVar4 = iVar9;
          iVar9 = iVar10;
          iVar3 = iVar1;
          uVar5 = (long)iVar8 * (long)(local_98->P).a[3] + (long)iVar3 * (long)(local_98->P).a[2] +
                  (long)iVar4 * (long)(local_98->P).a[1] + (long)iVar9 * (long)(local_98->P).a[0];
          uVar6 = (uVar5 >> 0x1f) + (uVar5 & 0x7fffffff);
          uVar5 = uVar6 - 0x1fffffffc;
          if (uVar6 < 0x1fffffffc) {
            uVar5 = uVar6;
          }
          uVar6 = uVar5 - 0xfffffffe;
          if (uVar5 < 0xfffffffe) {
            uVar6 = uVar5;
          }
          iVar10 = (int)uVar6 + -0x7fffffff;
          if (uVar6 < 0x7fffffff) {
            iVar10 = (int)uVar6;
          }
          lVar7 = lVar7 + -1;
          iVar8 = iVar3;
          iVar1 = iVar4;
        } while (lVar7 != 0);
        (local_98->S).r[3] = iVar3;
        (local_98->S).r[2] = iVar4;
        (local_98->S).r[1] = iVar9;
        (local_98->S).r[0] = iVar10;
      }
      lVar7 = local_a0 + 1;
    } while (lVar7 != local_38);
  }
  p_Var2 = local_40;
  std::_Tuple_impl<0ul,std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>::
  _Tuple_impl<std::vector<int,std::allocator<int>>&,std::vector<int,std::allocator<int>>&,void>
            (local_40,&local_68,&local_88);
  if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return (tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_> *)
         p_Var2;
}

Assistant:

std::tuple<std::vector<typename R::result_type>, std::vector<typename R::result_type>>
generate_list(R &r1, R &r2, const long N, const long skip1, const long skip2) {
  std::vector<typename R::result_type> v1, v2;
  if (N > 0) {
    v1.reserve(N);
    v2.reserve(N);
  }
  for (long i{0}; i < N; ++i) {
    v1.push_back(r1());
    v2.push_back(r2());
    for (long j{0}; j < skip1; ++j)
      r1();
    for (long j{0}; j < skip2; ++j)
      r2();
  }
  return {v1, v2};
}